

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall
Js::ScriptContext::AddDynamicProfileInfo<Memory::WriteBarrierPtr>
          (ScriptContext *this,FunctionBody *functionBody,
          WriteBarrierPtr<Js::DynamicProfileInfo> *dynamicProfileInfo)

{
  SourceDynamicProfileManager *this_00;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *this_01;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  LocalFunctionId LVar4;
  DynamicProfileInfo *in_RAX;
  ScriptContext *pSVar5;
  undefined4 *puVar6;
  SourceContextInfo *pSVar7;
  DynamicProfileInfo *ptr;
  DynamicProfileInfo *local_38;
  DynamicProfileInfo *newDynamicProfileInfo;
  
  local_38 = in_RAX;
  pSVar5 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  if (pSVar5 != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x161e,"(functionBody->GetScriptContext() == this)",
                                "functionBody->GetScriptContext() == this");
    if (!bVar2) goto LAB_006f72b5;
    *puVar6 = 0;
  }
  bVar2 = FunctionBody::HasValidSourceInfo(functionBody);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x161f,"(functionBody->HasValidSourceInfo())",
                                "functionBody->HasValidSourceInfo()");
    if (!bVar2) goto LAB_006f72b5;
    *puVar6 = 0;
  }
  ptr = dynamicProfileInfo->ptr;
  local_38 = ptr;
  pSVar7 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)functionBody);
  this_00 = (pSVar7->sourceDynamicProfileManager).ptr;
  if ((pSVar7->dwHostSourceContext == 0xffffffffffffffff) ||
     ((pSVar7->isHostDynamicDocument & 1U) != 0)) {
    if (this_00 == (SourceDynamicProfileManager *)0x0) {
      if (ptr == (DynamicProfileInfo *)0x0) {
        ptr = FunctionBody::AllocateDynamicProfile(functionBody);
        local_38 = ptr;
      }
      Memory::WriteBarrierPtr<Js::DynamicProfileInfo>::WriteBarrierSet(dynamicProfileInfo,ptr);
    }
    else {
      if (ptr == (DynamicProfileInfo *)0x0) {
        ptr = DynamicProfileInfo::New(this->recycler,functionBody,true);
        local_38 = ptr;
        LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
        SourceDynamicProfileManager::UpdateDynamicProfileInfo(this_00,LVar4,ptr);
        Memory::WriteBarrierPtr<Js::DynamicProfileInfo>::WriteBarrierSet(dynamicProfileInfo,ptr);
      }
      LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
      SourceDynamicProfileManager::MarkAsExecuted(this_00,LVar4);
      DynamicProfileInfo::UpdateFunctionInfo(ptr,functionBody,this->recycler);
    }
  }
  else {
    if (ptr == (DynamicProfileInfo *)0x0) {
      local_38 = FunctionBody::AllocateDynamicProfile(functionBody);
      Memory::WriteBarrierPtr<Js::DynamicProfileInfo>::WriteBarrierSet(dynamicProfileInfo,local_38);
    }
    uVar3 = FunctionBody::GetInterpretedCount(functionBody);
    if (uVar3 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x1643,"(functionBody->GetInterpretedCount() == 0)",
                                  "functionBody->GetInterpretedCount() == 0");
      if (!bVar2) goto LAB_006f72b5;
      *puVar6 = 0;
    }
    this_01 = (((this->super_ScriptContextBase).javascriptLibrary)->cache).profileInfoList.ptr;
    if (this_01 != (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
      SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::Prepend
                (this_01,this->recycler,&local_38);
    }
    if (this->startupComplete == false) {
      if (this_00 == (SourceDynamicProfileManager *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                    ,0x164d,"(profileManager)","profileManager");
        if (!bVar2) goto LAB_006f72b5;
        *puVar6 = 0;
      }
      LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
      SourceDynamicProfileManager::MarkAsExecuted(this_00,LVar4);
    }
  }
  if (dynamicProfileInfo->ptr == (DynamicProfileInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x1651,"(dynamicProfileInfo != nullptr)",
                                "dynamicProfileInfo != nullptr");
    if (!bVar2) {
LAB_006f72b5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  return;
}

Assistant:

void ScriptContext::AddDynamicProfileInfo(
        FunctionBody * functionBody, BarrierT<DynamicProfileInfo>& dynamicProfileInfo)
    {
        Assert(functionBody->GetScriptContext() == this);
        Assert(functionBody->HasValidSourceInfo());

        DynamicProfileInfo * newDynamicProfileInfo = dynamicProfileInfo;
        // If it is a dynamic script - we should create a profile info bound to the threadContext for its lifetime.
        SourceContextInfo* sourceContextInfo = functionBody->GetSourceContextInfo();
        SourceDynamicProfileManager* profileManager = sourceContextInfo->sourceDynamicProfileManager;
        if (sourceContextInfo->IsDynamic())
        {
            if (profileManager != nullptr)
            {
                // There is an in-memory cache and dynamic profile info is coming from there
                if (newDynamicProfileInfo == nullptr)
                {
                    newDynamicProfileInfo = DynamicProfileInfo::New(this->GetRecycler(), functionBody, true /* persistsAcrossScriptContexts */);
                    profileManager->UpdateDynamicProfileInfo(functionBody->GetLocalFunctionId(), newDynamicProfileInfo);
                    dynamicProfileInfo = newDynamicProfileInfo;
                }
                profileManager->MarkAsExecuted(functionBody->GetLocalFunctionId());
                newDynamicProfileInfo->UpdateFunctionInfo(functionBody, this->GetRecycler());
            }
            else
            {
                if (newDynamicProfileInfo == nullptr)
                {
                    newDynamicProfileInfo = functionBody->AllocateDynamicProfile();
                }
                dynamicProfileInfo = newDynamicProfileInfo;
            }
        }
        else
        {
            if (newDynamicProfileInfo == nullptr)
            {
                newDynamicProfileInfo = functionBody->AllocateDynamicProfile();
                dynamicProfileInfo = newDynamicProfileInfo;
            }
            Assert(functionBody->GetInterpretedCount() == 0);
#if DBG_DUMP || defined(DYNAMIC_PROFILE_STORAGE) || defined(RUNTIME_DATA_COLLECTION)

            if (this->Cache()->profileInfoList)
            {
                this->Cache()->profileInfoList->Prepend(this->GetRecycler(), newDynamicProfileInfo);
            }
#endif
            if (!startupComplete)
            {
                Assert(profileManager);
                profileManager->MarkAsExecuted(functionBody->GetLocalFunctionId());
            }
        }
        Assert(dynamicProfileInfo != nullptr);
    }